

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_MRS_reg(DisasContext_conflict1 *s,arg_MRS_reg *a)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 var;
  uint uVar1;
  uintptr_t o;
  TCGTemp *local_30;
  
  uVar1 = (uint)s->features;
  if ((uVar1 >> 9 & 1) == 0) {
    tcg_ctx = s->uc->tcg_ctx;
    if (a->r == 0) {
      var = tcg_temp_new_i32(tcg_ctx);
      local_30 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      tcg_gen_callN_aarch64
                (tcg_ctx,helper_cpsr_read_aarch64,(TCGTemp *)(var + (long)tcg_ctx),1,&local_30);
    }
    else {
      if (s->user != 0) {
        unallocated_encoding_aarch64(s);
        goto LAB_005f132c;
      }
      var = load_cpu_offset(tcg_ctx,0x158);
    }
    store_reg(s,a->rd,var);
  }
LAB_005f132c:
  return (uVar1 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MRS_reg(DisasContext *s, arg_MRS_reg *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (a->r) {
        if (IS_USER(s)) {
            unallocated_encoding(s);
            return true;
        }
        tmp = load_cpu_field(tcg_ctx, spsr);
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        gen_helper_cpsr_read(tcg_ctx, tmp, tcg_ctx->cpu_env);
    }
    store_reg(s, a->rd, tmp);
    return true;
}